

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_createtable(lua_State *L,int narray,int nrec)

{
  uint64_t uVar1;
  TValue *pTVar2;
  GCtab *pGVar3;
  
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  pTVar2 = L->top;
  pGVar3 = lj_tab_new_ah(L,narray,nrec);
  pTVar2->u64 = (ulong)pGVar3 | 0xfffa000000000000;
  pTVar2 = L->top;
  L->top = pTVar2 + 1;
  if (pTVar2 + 1 < (TValue *)(L->maxstack).ptr64) {
    return;
  }
  lj_state_growstack1(L);
  return;
}

Assistant:

LUA_API void lua_createtable(lua_State *L, int narray, int nrec)
{
  lj_gc_check(L);
  settabV(L, L->top, lj_tab_new_ah(L, narray, nrec));
  incr_top(L);
}